

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPController.cpp
# Opt level: O3

int __thiscall TCPController::poll(TCPController *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  ushort uVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  nfds_t nVar6;
  pollfd pfd;
  pollfd local_38;
  
  iVar3 = 0;
  do {
    if (__nfds != 0) {
      nVar6 = 0;
      do {
        local_38 = __fds[nVar6];
        std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
        iVar4 = std::
                _Hashtable<int,_std::pair<const_int,_std::shared_ptr<TCPConnection>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<TCPConnection>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&(this->connections)._M_h,&local_38.fd);
        if (iVar4.
            super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<TCPConnection>_>,_false>.
            _M_cur == (__node_type *)0x0) {
          pthread_rwlock_unlock((pthread_rwlock_t *)this);
        }
        else {
          pmVar5 = std::__detail::
                   _Map_base<int,_std::pair<const_int,_std::shared_ptr<TCPConnection>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<TCPConnection>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<int,_std::pair<const_int,_std::shared_ptr<TCPConnection>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<TCPConnection>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&this->connections,&local_38.fd);
          peVar2 = (pmVar5->super___shared_ptr<TCPConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          this_00 = (pmVar5->super___shared_ptr<TCPConnection,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount._M_pi;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_00->_M_use_count = this_00->_M_use_count + 1;
            }
          }
          pthread_rwlock_unlock((pthread_rwlock_t *)this);
          uVar1 = peVar2->poll_flags_;
          if ((local_38.events & uVar1) != 0) {
            __fds[nVar6].revents = uVar1;
            iVar3 = iVar3 + 1;
          }
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
        }
        nVar6 = nVar6 + 1;
      } while (__nfds != nVar6);
    }
  } while (iVar3 < 1);
  return iVar3;
}

Assistant:

int TCPController::poll(struct pollfd *fds, nfds_t nfds, int timeout) {
    int total_polls = 0;
    while (true) {
        for (int i = 0; i < nfds; i++) {
            struct pollfd pfd = fds[i];
            std::shared_lock lock(mutex_);
            if (connections.find(pfd.fd) != connections.end()) {
//                std::cout << "query on fd " << pfd.fd << "for event " << pfd.events << std::endl;
                auto conn = connections[pfd.fd];
                lock.unlock();
//                short flags = 0;
//                if (conn->hasRead()) {
//                    flags |= (POLLRDNORM | POLLRDBAND | POLLIN | POLLPRI);
//                }
//                flags |= (POLLOUT | POLLWRNORM | POLLWRBAND);
                if ((conn->hasRead() & pfd.events) != 0) {
//                    std::cout << "return on fd " << pfd.fd << "for event " << conn->hasRead() << std::endl;
                    fds[i].revents = conn->hasRead();
                    total_polls++;
                }
            }
        }
        if (total_polls > 0) {
            break;
        }

    }
    return total_polls;
}